

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_archiver.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> *
HuffmanArchiver::get_full_code(vector<bool,_std::allocator<bool>_> *code,int length)

{
  _Bit_iterator __last;
  _Bit_iterator __first;
  bool bVar1;
  byte bVar2;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  iterator iVar3;
  reference rVar4;
  reference rVar5;
  bool bit;
  iterator __end1;
  iterator __begin1;
  vector<bool,_std::allocator<bool>_> *__range1;
  size_t i;
  vector<bool,_std::allocator<bool>_> *res;
  _Bit_iterator_base *in_stack_fffffffffffffea8;
  _Bit_iterator_base *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  bool *in_stack_fffffffffffffec0;
  _Bit_type *in_stack_fffffffffffffec8;
  _Bit_type *__n;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffed0;
  _Bit_type *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  reference local_f0;
  reference local_e0;
  reference local_d0;
  undefined1 local_b9;
  _Bit_type *local_b8;
  uint local_b0;
  _Bit_type *local_a8;
  uint local_a0;
  _Bit_type *local_98;
  uint local_90;
  _Bit_type *local_88;
  uint local_80;
  vector<bool,_std::allocator<bool>_> *local_78;
  _Bit_type *local_70;
  uint local_68;
  _Bit_type *local_60;
  uint local_58;
  _Bit_type *local_50;
  uint local_48;
  _Bit_type *local_40;
  uint local_38;
  long local_30;
  undefined1 local_16;
  undefined1 local_15;
  
  local_15 = 0;
  local_16 = 1;
  std::allocator<bool>::allocator((allocator<bool> *)0x1255bf);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8,
             in_stack_fffffffffffffec0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  std::allocator<bool>::~allocator((allocator<bool> *)0x1255ea);
  local_30 = 0;
  iVar3 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)0x125600);
  local_50 = iVar3.super__Bit_iterator_base._M_p;
  local_48 = iVar3.super__Bit_iterator_base._M_offset;
  local_40 = local_50;
  local_38 = local_48;
  iVar3 = std::vector<bool,_std::allocator<bool>_>::end(in_RSI);
  local_70 = iVar3.super__Bit_iterator_base._M_p;
  local_68 = iVar3.super__Bit_iterator_base._M_offset;
  __first.super__Bit_iterator_base._8_7_ = in_stack_fffffffffffffee0;
  __first.super__Bit_iterator_base._M_p = in_stack_fffffffffffffed8;
  __first.super__Bit_iterator_base._15_1_ = in_stack_fffffffffffffee7;
  __last.super__Bit_iterator_base._8_8_ = in_stack_fffffffffffffed0;
  __last.super__Bit_iterator_base._M_p = in_stack_fffffffffffffec8;
  local_60 = local_70;
  local_58 = local_68;
  std::reverse<std::_Bit_iterator>(__first,__last);
  local_78 = in_RSI;
  iVar3 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)0x1256a3);
  local_98 = iVar3.super__Bit_iterator_base._M_p;
  local_90 = iVar3.super__Bit_iterator_base._M_offset;
  local_88 = local_98;
  local_80 = local_90;
  iVar3 = std::vector<bool,_std::allocator<bool>_>::end(local_78);
  rVar4._M_mask = (_Bit_type)in_stack_fffffffffffffed0;
  rVar4._M_p = in_stack_fffffffffffffed8;
  rVar5._M_mask = (_Bit_type)in_stack_fffffffffffffec0;
  rVar5._M_p = in_stack_fffffffffffffec8;
  local_b8 = iVar3.super__Bit_iterator_base._M_p;
  local_b0 = iVar3.super__Bit_iterator_base._M_offset;
  local_a8 = local_b8;
  local_a0 = local_b0;
  while( true ) {
    bVar1 = std::operator!=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    if (!bVar1) break;
    rVar4 = std::_Bit_iterator::operator*((_Bit_iterator *)0x12573f);
    __n = rVar5._M_p;
    local_d0 = rVar4;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_d0);
    local_b9 = bVar2;
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)rVar4._M_mask,(size_type)__n);
    local_e0 = rVar5;
    std::_Bit_reference::operator=(&local_e0,(bool)(bVar2 & 1));
    local_30 = local_30 + 1;
    std::_Bit_iterator::operator++((_Bit_iterator *)in_stack_fffffffffffffeb0);
  }
  local_f0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)rVar4._M_mask,(size_type)rVar5._M_p);
  std::_Bit_reference::operator=(&local_f0,false);
  return in_RDI;
}

Assistant:

std::vector<bool> HuffmanArchiver::get_full_code(std::vector<bool> code, int length) {
    std::vector<bool> res(length, true);
    std::size_t i = 0;
    std::reverse(code.begin(), code.end());
    for (bool bit : code) {
        res[i] = bit;
        i++;
    }
    res[i] = false;
    return res;
}